

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O3

int ECDSA_size(EC_KEY *eckey)

{
  uint uVar1;
  EC_GROUP *group;
  BIGNUM *bn;
  size_t sVar2;
  
  if (eckey != (EC_KEY *)0x0) {
    group = (EC_GROUP *)EC_KEY_get0_group(eckey);
    if (group != (EC_GROUP *)0x0) {
      bn = EC_GROUP_get0_order(group);
      uVar1 = BN_num_bytes(bn);
      sVar2 = ECDSA_SIG_max_len((ulong)uVar1);
      return (int)sVar2;
    }
  }
  return 0;
}

Assistant:

size_t ECDSA_size(const EC_KEY *key) {
  if (key == NULL) {
    return 0;
  }

  const EC_GROUP *group = EC_KEY_get0_group(key);
  if (group == NULL) {
    return 0;
  }

  size_t group_order_size = BN_num_bytes(EC_GROUP_get0_order(group));
  return ECDSA_SIG_max_len(group_order_size);
}